

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsPath.cpp
# Opt level: O3

void __thiscall WindowsPath::FromFileURL(WindowsPath *this,FileURL *inFileURL)

{
  StringList *this_00;
  size_t *psVar1;
  char cVar2;
  _List_node_base *p_Var3;
  undefined8 uVar4;
  long *unaff_RBP;
  SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  itComponents;
  _List_node_base *local_a8;
  _List_node_base *local_a0;
  _List_node_base local_98;
  SingleValueContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  _List_node_base *local_70;
  long local_68;
  _List_node_base local_60;
  long *local_50 [2];
  long local_40 [2];
  
  FileURL::GetComponentsIterator_abi_cxx11_(&local_88,inFileURL);
  this_00 = &this->mPathComponents;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&this_00->
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
  (this->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mPathComponents).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::string::_M_replace
            ((ulong)this,0,(char *)(this->mDriveLetter)._M_string_length,0x33600a);
  if (local_88.
      super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .mCurrentPosition._M_node ==
      local_88.
      super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .mEndPosition._M_node) {
    return;
  }
  if (local_88.
      super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .mFirstMove == true) {
    local_88.
    super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .mFirstMove = false;
  }
  else {
    local_88.
    super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .mCurrentPosition._M_node =
         (local_88.
          super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          .mCurrentPosition._M_node)->_M_next;
    if (local_88.
        super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .mCurrentPosition._M_node ==
        local_88.
        super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .mEndPosition._M_node) {
      return;
    }
  }
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,
             local_88.
             super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .mCurrentPosition._M_node[1]._M_next,
             (long)&(local_88.
                     super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .mCurrentPosition._M_node[1]._M_prev)->_M_next +
             (long)local_88.
                   super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .mCurrentPosition._M_node[1]._M_next);
  local_70 = &local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,
             local_88.
             super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .mCurrentPosition._M_node[1]._M_next,
             (long)&(local_88.
                     super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .mCurrentPosition._M_node[1]._M_prev)->_M_next +
             (long)local_88.
                   super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .mCurrentPosition._M_node[1]._M_next);
  if (local_a0 <= (_List_node_base *)(local_68 + -1)) {
    uVar4 = std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    if (local_50[0] != unaff_RBP) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,(ulong)((long)&(local_60._M_next)->_M_next + 1));
    }
    _Unwind_Resume(uVar4);
  }
  cVar2 = *(char *)((long)local_a8 + local_68 + -1);
  if (local_70 != &local_60) {
    operator_delete(local_70,(ulong)((long)&(local_60._M_next)->_M_next + 1));
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,CONCAT71(local_98._M_next._1_7_,local_98._M_next._0_1_) + 1);
  }
  if (cVar2 == '|') {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,
               local_88.
               super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .mCurrentPosition._M_node[1]._M_next,
               (long)&(local_88.
                       super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .mCurrentPosition._M_node[1]._M_prev)->_M_next +
               (long)local_88.
                     super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .mCurrentPosition._M_node[1]._M_next);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,
               local_88.
               super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .mCurrentPosition._M_node[1]._M_next,
               (long)&(local_88.
                       super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .mCurrentPosition._M_node[1]._M_prev)->_M_next +
               (long)local_88.
                     super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .mCurrentPosition._M_node[1]._M_next);
    std::__cxx11::string::substr((ulong)&local_a8,(ulong)&local_70);
    std::__cxx11::string::operator=((string *)this,(string *)&local_a8);
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(local_98._M_next._1_7_,local_98._M_next._0_1_) + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    p_Var3 = local_70;
    if (local_70 == &local_60) goto LAB_00193258;
  }
  else {
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,
               local_88.
               super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .mCurrentPosition._M_node[1]._M_next,
               (long)&(local_88.
                       super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .mCurrentPosition._M_node[1]._M_prev)->_M_next +
               (long)local_88.
                     super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     .mCurrentPosition._M_node[1]._M_next);
    p_Var3 = (_List_node_base *)operator_new(0x30);
    p_Var3[1]._M_next = p_Var3 + 2;
    if (local_a8 == &local_98) {
      p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_98._M_next._1_7_,local_98._M_next._0_1_)
      ;
      p_Var3[2]._M_prev = local_98._M_prev;
    }
    else {
      p_Var3[1]._M_next = local_a8;
      p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_98._M_next._1_7_,local_98._M_next._0_1_)
      ;
    }
    p_Var3[1]._M_prev = local_a0;
    local_a0 = (_List_node_base *)0x0;
    local_98._M_next._0_1_ = 0;
    local_a8 = &local_98;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->mPathComponents).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_a8 == &local_98) goto LAB_00193258;
    local_60._M_next = (_List_node_base *)CONCAT71(local_98._M_next._1_7_,local_98._M_next._0_1_);
    p_Var3 = local_a8;
  }
  operator_delete(p_Var3,(ulong)((long)&(local_60._M_next)->_M_next + 1));
LAB_00193258:
  if (local_88.
      super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .mCurrentPosition._M_node !=
      local_88.
      super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .mEndPosition._M_node) {
    do {
      if (local_88.
          super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          .mFirstMove == true) {
        local_88.
        super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .mFirstMove = false;
      }
      else {
        local_88.
        super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .mCurrentPosition._M_node =
             (local_88.
              super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .mCurrentPosition._M_node)->_M_next;
        if (local_88.
            super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .mCurrentPosition._M_node ==
            local_88.
            super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            .mEndPosition._M_node) {
          return;
        }
      }
      local_a8 = &local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a8,
                 local_88.
                 super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 .mCurrentPosition._M_node[1]._M_next,
                 (long)&(local_88.
                         super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .mCurrentPosition._M_node[1]._M_prev)->_M_next +
                 (long)local_88.
                       super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       .mCurrentPosition._M_node[1]._M_next);
      p_Var3 = (_List_node_base *)operator_new(0x30);
      p_Var3[1]._M_next = p_Var3 + 2;
      if (local_a8 == &local_98) {
        p_Var3[2]._M_next =
             (_List_node_base *)CONCAT71(local_98._M_next._1_7_,local_98._M_next._0_1_);
        p_Var3[2]._M_prev = local_98._M_prev;
      }
      else {
        p_Var3[1]._M_next = local_a8;
        p_Var3[2]._M_next =
             (_List_node_base *)CONCAT71(local_98._M_next._1_7_,local_98._M_next._0_1_);
      }
      p_Var3[1]._M_prev = local_a0;
      local_a0 = (_List_node_base *)0x0;
      local_98._M_next._0_1_ = 0;
      local_a8 = &local_98;
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->mPathComponents).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if (local_a8 != &local_98) {
        operator_delete(local_a8,CONCAT71(local_98._M_next._1_7_,local_98._M_next._0_1_) + 1);
      }
    } while (local_88.
             super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .mCurrentPosition._M_node !=
             local_88.
             super_ContainerIterator<const_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .mEndPosition._M_node);
  }
  return;
}

Assistant:

void WindowsPath::FromFileURL(const FileURL& inFileURL)
{
    SingleValueContainerIterator<const StringList> itComponents = inFileURL.GetComponentsIterator();

 	mPathComponents.clear();
	mDriveLetter = "";	   
    
    // move to first component (if empty...just return)
    if(!itComponents.MoveNext())
        return;
    
    // check first component, if it's a drive letter
    if(itComponents.GetItem().at(itComponents.GetItem().length() - 1) == '|')
        mDriveLetter = itComponents.GetItem().substr(0,itComponents.GetItem().length() - 1);
    else
        mPathComponents.push_back(itComponents.GetItem());
    
    while(itComponents.MoveNext())
        mPathComponents.push_back(itComponents.GetItem());
        
}